

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void env_arr_put(char *identifer,int line,long index,Object value,Environment *env)

{
  undefined8 *puVar1;
  char ***pppcVar2;
  anon_union_8_4_50a03f35_for_Literal_2 *paVar3;
  Object *pOVar4;
  Record *pRVar5;
  char *__format;
  
  pRVar5 = env_match(identifer,env);
  if (pRVar5 == (Record *)0x0) {
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] Undefined array %s!\x1b[0m";
  }
  else if ((pRVar5->object).type == OBJECT_ARRAY) {
    if ((0 < index) && (index <= (pRVar5->object).field_1.literal.line)) goto LAB_0010678f;
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] Array index out of range [%ld]!\x1b[0m";
    identifer = (char *)index;
  }
  else {
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] Variable %s is not an array!\x1b[0m";
  }
  printf(__format,line,identifer);
  stop();
LAB_0010678f:
  pOVar4 = (pRVar5->object).field_1.arr.values;
  puVar1 = (undefined8 *)((long)&pOVar4[index + -1].field_1 + 0x28);
  *puVar1 = value.field_1.container.constructor.statements;
  puVar1[1] = value.field_1.routine.code.statements;
  pppcVar2 = &pOVar4[index + -1].field_1.routine.arguments;
  *pppcVar2 = value.field_1.routine.arguments;
  pppcVar2[1] = (char **)value.field_1._32_8_;
  paVar3 = &pOVar4[index + -1].field_1.literal.field_2;
  *paVar3 = value.field_1.literal.field_2;
  paVar3[1] = (anon_union_8_4_50a03f35_for_Literal_2)value.field_1._16_8_;
  pOVar4 = pOVar4 + index + -1;
  pOVar4->type = value.type;
  *(undefined4 *)&pOVar4->field_0x4 = value._4_4_;
  (pOVar4->field_1).instance = value.field_1.instance;
  return;
}

Assistant:

void env_arr_put(char *identifer, int line, long index, Object value, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL){
        printf(runtime_error("Undefined array %s!"), line, identifer);
        stop();
    }
    else if(get->object.type != OBJECT_ARRAY){
        printf(runtime_error("Variable %s is not an array!"), line, identifer);
        stop();
    }
    else if(index < 1 || get->object.arr.count < index){
        printf(runtime_error("Array index out of range [%ld]!"), line, index);
        stop();
    }

    get->object.arr.values[index - 1] = value;
}